

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port_tests.cpp
# Opt level: O3

void __thiscall
iu_PortableTest_x_iutest_x_FileStat_Test::Body(iu_PortableTest_x_iutest_x_FileStat_Test *this)

{
  int *in_R9;
  AssertionResult iutest_ar;
  StatStruct st;
  allocator<char> local_281;
  AssertionResult local_280;
  AssertionHelper local_258;
  undefined1 local_228 [392];
  stat64 local_a0;
  
  local_228._0_4_ = 0;
  local_258.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ =
       fstat64(0,&local_a0);
  iutest::internal::CmpHelperEQ<int,int>
            (&local_280,(internal *)0x12343f,"::iutest::internal::posix::FileStat(0, &st)",local_228
             ,(int *)&local_258,in_R9);
  if (local_280.m_result == false) {
    memset((iu_global_format_stringstream *)local_228,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_228);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,local_280.m_message._M_dataplus._M_p,&local_281);
    local_258.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/port_tests.cpp";
    local_258.m_part_result.super_iuCodeMessage.m_line = 0x31;
    local_258.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_258,(Fixed *)local_228,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_258.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    (int)local_258.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) !=
        &local_258.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_258.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               (int)local_258.m_part_result.super_iuCodeMessage.m_message.
                                    _M_dataplus._M_p),
                      local_258.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_228);
    std::ios_base::~ios_base((ios_base *)(local_228 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280.m_message._M_dataplus._M_p != &local_280.m_message.field_2) {
    operator_delete(local_280.m_message._M_dataplus._M_p,
                    local_280.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(PortableTest, FileStat)
{
    ::iutest::internal::posix::StatStruct st;
    IUTEST_ASSERT_EQ(0, ::iutest::internal::posix::FileStat(0, &st));
}